

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_sign_recoverable
              (secp256k1_context *ctx,secp256k1_ecdsa_recoverable_signature *signature,
              uchar *msghash32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  int recid;
  secp256k1_scalar s;
  secp256k1_scalar r;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_sign_recoverable_cold_5();
  }
  else if ((ctx->ecmult_gen_ctx).built != 0) {
    if (msghash32 == (uchar *)0x0) {
      secp256k1_ecdsa_sign_recoverable_cold_3();
      return 0;
    }
    if (signature != (secp256k1_ecdsa_recoverable_signature *)0x0) {
      if (seckey == (uchar *)0x0) {
        secp256k1_ecdsa_sign_recoverable_cold_1();
        return 0;
      }
      iVar1 = secp256k1_ecdsa_sign_inner(ctx,&r,&s,&recid,msghash32,seckey,noncefp,noncedata);
      secp256k1_ecdsa_recoverable_signature_save(signature,&r,&s,recid);
      return iVar1;
    }
    secp256k1_ecdsa_sign_recoverable_cold_2();
    return 0;
  }
  secp256k1_ecdsa_sign_recoverable_cold_4();
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign_recoverable(const secp256k1_context* ctx, secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret, recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, &recid, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_recoverable_signature_save(signature, &r, &s, recid);
    return ret;
}